

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int __thiscall geemuboi::core::CPU::cp_mhl(CPU *this)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  byte bVar4;
  
  uVar2._0_1_ = this->regs->h;
  uVar2._1_1_ = this->regs->l;
  iVar3 = (**this->mmu->_vptr_IMmu)(this->mmu,(ulong)(ushort)(uVar2 << 8 | uVar2 >> 8));
  bVar1 = this->regs->a;
  bVar4 = (byte)iVar3;
  this->regs->f =
       ((bVar1 != bVar4) << 7 | (bVar1 < bVar4) << 4 | ((bVar1 & 0xf) < (bVar4 & 0xf)) << 5) - 0x40;
  return 2;
}

Assistant:

int CPU::cp_mhl() {
    uint16_t addr = (regs.h << 8) + regs.l;
    cp_r8(mmu.read_byte(addr));
    return 2;
}